

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CGL::Application::Application(Application *this,AppConfig *config,bool gl)

{
  void *max_ray_depth;
  byte in_DL;
  RaytracedRenderer *in_RSI;
  Renderer *in_RDI;
  DrawStyle *in_stack_fffffffffffffe60;
  OSDText *in_stack_fffffffffffffea0;
  double flare_intensity;
  PathTracer *flare_radius;
  Camera *focalDistance;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar1;
  undefined8 uVar2;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 uVar3;
  bool *ns_diff;
  bool *this_00;
  bool *ns_aa;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 uVar4;
  size_t in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  HDRImageBuffer *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string local_68 [55];
  byte local_31;
  
  local_31 = in_DL & 1;
  Renderer::Renderer(in_RDI);
  in_RDI->_vptr_Renderer = (_func_int **)&PTR__Application_00398810;
  Camera::Camera((Camera *)in_stack_fffffffffffffe60);
  Camera::Camera((Camera *)in_stack_fffffffffffffe60);
  GLScene::DrawStyle::DrawStyle(in_stack_fffffffffffffe60);
  GLScene::DrawStyle::DrawStyle(in_stack_fffffffffffffe60);
  GLScene::DrawStyle::DrawStyle(in_stack_fffffffffffffe60);
  ns_aa = &in_RDI[0x38].use_hdpi;
  OSDText::OSDText(in_stack_fffffffffffffea0);
  Color::Color((Color *)&in_RDI[0x3e].use_hdpi,0.0,0.0,0.0);
  ns_diff = &in_RDI[0x3f].use_hdpi;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1773da);
  this_00 = &in_RDI[0x41].use_hdpi;
  std::__cxx11::string::string((string *)this_00);
  *(byte *)((long)&in_RDI[0x41]._vptr_Renderer + 2) = local_31 & 1;
  max_ray_depth = operator_new(0x2a0);
  uVar4 = 1;
  flare_intensity = *(double *)&(in_RSI->super_OfflineRenderer).render_cell;
  flare_radius = in_RSI->pt;
  focalDistance = in_RSI->camera;
  uVar1 = *(undefined4 *)&in_RSI->scene;
  uVar2 = *(undefined8 *)&in_RSI->state;
  uVar3 = *(undefined1 *)
           &(in_RSI->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::__cxx11::string::string
            (local_68,(string *)
                      &(in_RSI->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff78,(string *)&in_RSI->lensRadius);
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff58,(string *)&in_RSI->ghost_aperture_filename);
  RaytracedRenderer::RaytracedRenderer
            (in_RSI,(size_t)ns_aa,(size_t)max_ray_depth,(size_t)this_00,(size_t)ns_diff,
             CONCAT17(uVar3,in_stack_ffffffffffffff18),CONCAT17(uVar4,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,(float)((ulong)uVar2 >> 0x20),
             in_stack_ffffffffffffff68,SUB81((ulong)uVar2 >> 0x18,0),in_stack_ffffffffffffff78,
             (double)CONCAT44(uVar1,in_stack_ffffffffffffff08),(double)focalDistance,
             in_stack_ffffffffffffff80,(double)flare_radius,flare_intensity,
             in_stack_ffffffffffffff88);
  *(void **)&in_RDI[2].use_hdpi = max_ray_depth;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::operator=
            ((string *)&in_RDI[0x41].use_hdpi,
             (string *)
             &(in_RSI->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish);
  return;
}

Assistant:

Application::Application(AppConfig config, bool gl) {
  gl_window = gl;
  renderer = new RaytracedRenderer (
    config.pathtracer_ns_aa,
    config.pathtracer_max_ray_depth,
    config.pathtracer_ns_area_light,
    config.pathtracer_ns_diff,
    config.pathtracer_ns_glsy,
    config.pathtracer_ns_refr,
    config.pathtracer_num_threads,
    config.pathtracer_samples_per_patch,
    config.pathtracer_max_tolerance,
    config.pathtracer_envmap,
    config.pathtracer_direct_hemisphere_sample,
    config.pathtracer_filename,
    config.pathtracer_lensRadius,
    config.pathtracer_focalDistance,
    config.aperture_filename,
    config.pathtracer_lens_flare_radius,
    config.pathtracer_lens_flare_intensity,
		config.ghost_aperture_filename
  );
  filename = config.pathtracer_filename;
}